

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O2

void * TPZDohrAssembleList<std::complex<double>_>::Assemble(void *voidptr)

{
  TPZReference *in_RAX;
  lock_guard<std::mutex> lock;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> work;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> local_28;
  
  local_28.fRef = in_RAX;
  while (0 < *voidptr) {
    PopItem((TPZDohrAssembleList<std::complex<double>_> *)&stack0xffffffffffffffd8);
    if ((local_28.fRef == (TPZReference *)0x0) ||
       ((local_28.fRef)->fPointer == (TPZDohrAssembleItem<std::complex<double>_> *)0x0)) {
      TPZSemaphore::Wait((TPZSemaphore *)((long)voidptr + 8));
    }
    else {
      std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)voidptr + 0x90))->__data);
      TPZDohrAssembly<std::complex<double>_>::Assemble
                ((TPZDohrAssembly<std::complex<double>_> *)**(undefined8 **)((long)voidptr + 0xd0),
                 (local_28.fRef)->fPointer->fSubIndex,&(local_28.fRef)->fPointer->fAssembleData,
                 *(TPZFMatrix<std::complex<double>_> **)((long)voidptr + 0xd8));
      pthread_mutex_unlock((pthread_mutex_t *)((long)voidptr + 0x90));
    }
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer
              (&stack0xffffffffffffffd8);
  }
  return voidptr;
}

Assistant:

void *TPZDohrAssembleList<TVar>::Assemble(void *voidptr)
{
	TPZDohrAssembleList *myptr = (TPZDohrAssembleList *) voidptr;
	while (myptr->fNumItems > 0) {
		TPZAutoPointer<TPZDohrAssembleItem<TVar> > work = myptr->PopItem();
		if (work) {
            std::lock_guard<std::mutex> lock(myptr->fAssemblyLock);
			myptr->fAssembleIndexes->Assemble(work->fSubIndex,work->fAssembleData,*(myptr->fOutput));
		}
		else {
			// wait for a signal
			myptr->fSemaphore.Wait();
		}
	}
	return voidptr;
}